

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O2

int list_delete_many(AD **list,_func_Boolean_AD_ptr_Pointer *pred,Pointer closure,
                    _func_void_AD_ptr *action)

{
  AD *pAVar1;
  Boolean BVar2;
  _AD **pp_Var3;
  int iVar4;
  AD *pAVar5;
  AD *pAVar6;
  
  iVar4 = 0;
  pAVar5 = (AD *)0x0;
  pp_Var3 = list;
  while (pAVar1 = *pp_Var3, pAVar1 != (AD *)0x0) {
    BVar2 = (*pred)(pAVar1,closure);
    pAVar6 = pAVar1;
    if (BVar2 != 0) {
      if (action != (_func_void_AD_ptr *)0x0) {
        (*action)(pAVar1);
      }
      pp_Var3 = &pAVar5->next;
      if (pAVar5 == (AD *)0x0) {
        pp_Var3 = list;
      }
      *pp_Var3 = pAVar1->next;
      iVar4 = iVar4 + 1;
      pAVar6 = pAVar5;
    }
    pAVar5 = pAVar6;
    pp_Var3 = &pAVar1->next;
  }
  return iVar4;
}

Assistant:

private int list_delete_many(list, pred, closure, action)
    AD        **list;        /* the list to search */
    Boolean    (*pred)(AD *, Pointer);    /* predicate */
    Pointer    closure;    /* for pred */
    void    (*action)(AD *);    /* to apply before deletion */
{
    AD        *ad1;        /* lead traversal pointer */
    AD        *ad2;        /* trailing traversal pointer */
    int        ndeleted = 0;    /* # of elements deleted from list */

    for (ad2 = (AD *)NULL, ad1 = *list; ad1; ad1 = ad1->next)
    {
        /* does ad1 match? */
        if ((*pred)(ad1, closure))
        {
            /* yes; apply action, then delete ad1 from list */
            if (action != (void (*)())NULL)
                (*action)(ad1);
            if (ad2)
            {
                /* ad1 is second or later element */
                ad2->next = ad1->next;
            }
            else
            {
                /* ad1 is first element */
                *list = ad1->next;
            }

            ndeleted++;
        }
        else
        {
            /* no; ad1 survives, so scoot ad2 along */
            ad2 = ad1;
        }
    }

    /* return the # of elements deleted from list */
    return ndeleted;
}